

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O3

Io_BlifObj_t ** Io_BlifHashLookup(Io_BlifMan_t *p,char *pName)

{
  Io_BlifObj_t *pIVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *in_RDX;
  uint uVar5;
  char cVar6;
  Io_BlifObj_t **ppIVar7;
  Io_BlifObj_t *pIVar8;
  
  cVar6 = *in_RDX;
  uVar2 = 0;
  if (cVar6 != '\0') {
    uVar4 = 1;
    uVar5 = 0;
    do {
      uVar2 = uVar2 ^ (int)cVar6 * (int)cVar6 *
                      (&Io_BlifHashString_s_Primes)[~((uVar5 / 10) * 10) + uVar4];
      uVar5 = uVar5 + 1;
      cVar6 = in_RDX[uVar4];
      uVar4 = uVar4 + 1;
    } while (cVar6 != '\0');
  }
  ppIVar7 = (Io_BlifObj_t **)(&p->pFileName + (ulong)uVar2 % ((ulong)pName & 0xffffffff));
  pIVar1 = *ppIVar7;
  if (pIVar1 != (Io_BlifObj_t *)0x0) {
    iVar3 = strcmp(pIVar1->pName,in_RDX);
    if (iVar3 != 0) {
      do {
        pIVar8 = pIVar1;
        pIVar1 = pIVar8->pNext;
        if (pIVar1 == (Io_BlifObj_t *)0x0) break;
        iVar3 = strcmp(pIVar1->pName,in_RDX);
      } while (iVar3 != 0);
      ppIVar7 = &pIVar8->pNext;
    }
  }
  return ppIVar7;
}

Assistant:

static Io_BlifObj_t ** Io_BlifHashLookup( Io_BlifMan_t * p, char * pName )
{
    Io_BlifObj_t ** ppEntry;
    for ( ppEntry = p->pTable + Io_BlifHashString(pName, p->nTableSize); *ppEntry; ppEntry = &(*ppEntry)->pNext )
        if ( !strcmp((*ppEntry)->pName, pName) )
            return ppEntry;
    return ppEntry;
}